

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

TAddress * __thiscall
GGSock::Communicator::getPeerAddress_abi_cxx11_(TAddress *__return_storage_ptr__,Communicator *this)

{
  pthread_mutex_t *__mutex;
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> _Var1;
  int iVar2;
  char *pcVar3;
  allocator local_19;
  
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  __mutex = (pthread_mutex_t *)&(_Var1._M_head_impl)->mutex;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    pcVar3 = inet_ntoa((in_addr)((in_addr *)((long)&(_Var1._M_head_impl)->peeraddr + 4))->s_addr);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_19);
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

TAddress Communicator::getPeerAddress() const {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        return inet_ntoa(data.peeraddr.sin_addr);
    }